

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O0

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>::page
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true> *this,int start,
          int end,uint8_t *read,uint8_t *write)

{
  int local_2c;
  uint8_t *puStack_28;
  int position;
  uint8_t *write_local;
  uint8_t *read_local;
  int end_local;
  int start_local;
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true> *this_local;
  
  puStack_28 = write;
  write_local = read;
  for (local_2c = start; local_2c < end; local_2c = local_2c + 1) {
    this->read_pages_[local_2c] = write_local;
    if (write_local != (uint8_t *)0x0) {
      write_local = write_local + 0x100;
    }
    this->write_pages_[local_2c] = puStack_28;
    if (puStack_28 != (uint8_t *)0x0) {
      puStack_28 = puStack_28 + 0x100;
    }
  }
  return;
}

Assistant:

void page(int start, int end, uint8_t *read, uint8_t *write) {
			for(int position = start; position < end; ++position) {
				read_pages_[position] = read;
				if(read) read += 256;

				write_pages_[position] = write;
				if(write) write += 256;
			}
		}